

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<Fad<long_double>_>::Resize(TPZVec<Fad<long_double>_> *this,int64_t newsize)

{
  Fad<long_double> *pFVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong in_RSI;
  long in_RDI;
  ulong uVar7;
  int64_t i;
  int64_t large;
  Fad<long_double> *newstore;
  Fad<long_double> *in_stack_ffffffffffffff18;
  Fad<long_double> *in_stack_ffffffffffffff20;
  Fad<long_double> *this_01;
  Fad<long_double> *in_stack_ffffffffffffff30;
  long lVar8;
  ulong local_a8;
  long local_90;
  long local_38;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    pvVar3 = (void *)std::ostream::operator<<(this_00,in_RSI);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      *(undefined8 *)(in_RDI + 0x10) = 0;
      *(undefined8 *)(in_RDI + 0x18) = 0;
      lVar6 = *(long *)(in_RDI + 8);
      if (lVar6 != 0) {
        lVar8 = *(long *)(lVar6 + -8);
        for (lVar4 = lVar6 + lVar8 * 0x30; lVar6 != lVar4; lVar4 = lVar4 + -0x30) {
          Fad<long_double>::~Fad(in_stack_ffffffffffffff20);
        }
        operator_delete__((void *)(lVar6 + -0x10),lVar8 * 0x30 + 0x10);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar5 = SUB168(auVar2 * ZEXT816(0x30),0);
      uVar7 = uVar5 + 0x10;
      if (SUB168(auVar2 * ZEXT816(0x30),8) != 0 || 0xffffffffffffffef < uVar5) {
        uVar7 = 0xffffffffffffffff;
      }
      pvVar3 = operator_new__(uVar7);
      *(ulong *)((long)pvVar3 + 8) = in_RSI;
      lVar6 = (long)pvVar3 + 0x10;
      if (in_RSI != 0) {
        local_90 = lVar6;
        do {
          Fad<long_double>::Fad(in_stack_ffffffffffffff30);
          local_90 = local_90 + 0x30;
        } while (local_90 != lVar6 + in_RSI * 0x30);
      }
      local_a8 = in_RSI;
      if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
        local_a8 = *(ulong *)(in_RDI + 0x10);
      }
      for (local_38 = 0; local_38 < (long)local_a8; local_38 = local_38 + 1) {
        Fad<long_double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
      if ((*(long *)(in_RDI + 8) != 0) &&
         (pFVar1 = *(Fad<long_double> **)(in_RDI + 8), pFVar1 != (Fad<long_double> *)0x0)) {
        lVar8 = *(long *)((long)&pFVar1[-1].defaultVal + 8);
        this_01 = pFVar1 + lVar8;
        while (pFVar1 != this_01) {
          this_01 = this_01 + -1;
          Fad<long_double>::~Fad(this_01);
        }
        operator_delete__(&pFVar1[-1].defaultVal,lVar8 * 0x30 + 0x10);
      }
      *(long *)(in_RDI + 8) = lVar6;
      *(ulong *)(in_RDI + 0x10) = in_RSI;
      *(ulong *)(in_RDI + 0x18) = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}